

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::
WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          size_t *nextreturnperiod_index,double *last_return_period,OASIS_FLOAT *last_loss,
          double current_return_period,OASIS_FLOAT current_loss,int summary_id,int eptype,int epcalc
          ,double max_retperiod,int counter,OASIS_FLOAT tvar,
          map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,offset_in_aggreports_to_subr WriteOutput,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  double dVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  long *plVar5;
  OASIS_FLOAT OVar6;
  double dVar7;
  map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
  *in_stack_00000038;
  code *local_b0;
  OASIS_FLOAT loss;
  double nextreturnperiod_value;
  offset_in_aggreports_to_subr WriteOutput_local;
  float local_4c;
  OASIS_FLOAT tvar_local;
  double max_retperiod_local;
  int summary_id_local;
  OASIS_FLOAT current_loss_local;
  double current_return_period_local;
  OASIS_FLOAT *last_loss_local;
  double *last_return_period_local;
  size_t *nextreturnperiod_index_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  local_4c = tvar;
  max_retperiod_local._0_4_ = summary_id;
  max_retperiod_local._4_4_ = current_loss;
  _summary_id_local = current_return_period;
  current_return_period_local = (double)last_loss;
  last_loss_local = (OASIS_FLOAT *)last_return_period;
  last_return_period_local = (double *)nextreturnperiod_index;
  nextreturnperiod_index_local = (size_t *)fileIDs;
  fileIDs_local = (vector<int,_std::allocator<int>_> *)this;
  do {
    dVar7 = *last_return_period_local;
    dVar1 = (double)std::vector<int,_std::allocator<int>_>::size(&this->returnperiods_);
    if ((ulong)dVar1 <= (ulong)dVar7) {
      return;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->returnperiods_,(size_type)*last_return_period_local);
    dVar7 = (double)*pvVar2;
    if (dVar7 < _summary_id_local) break;
    if (dVar7 <= max_retperiod) {
      OVar6 = GetLoss(this,dVar7,*(double *)last_loss_local,
                      *(OASIS_FLOAT *)current_return_period_local,_summary_id_local,
                      max_retperiod_local._4_4_);
      if (WriteOutput != 0 ||
          WriteOutput != 0 &&
          mean_map !=
          (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
           *)0x0) {
        plVar5 = (long *)(&(mean_map->_M_t)._M_impl.field_0x0 + (long)&this->totalperiods_);
        if ((WriteOutput & 1) == 0) {
          local_b0 = (code *)WriteOutput;
        }
        else {
          local_b0 = *(code **)(*plVar5 + (WriteOutput - 1));
        }
        (*local_b0)(dVar7,plVar5,nextreturnperiod_index_local,max_retperiod_local._0_4_,epcalc,
                    eptype);
      }
      if (in_stack_00000038 !=
          (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
           *)0x0) {
        pmVar3 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[](in_stack_00000038,(key_type *)&max_retperiod_local);
        pvVar4 = std::vector<mean_count,_std::allocator<mean_count>_>::operator[]
                           (pmVar3,(size_type)*last_return_period_local);
        pvVar4->retperiod = dVar7;
        pmVar3 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[](in_stack_00000038,(key_type *)&max_retperiod_local);
        pvVar4 = std::vector<mean_count,_std::allocator<mean_count>_>::operator[]
                           (pmVar3,(size_type)*last_return_period_local);
        pvVar4->mean = (double)OVar6 + pvVar4->mean;
        pmVar3 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[](in_stack_00000038,(key_type *)&max_retperiod_local);
        pvVar4 = std::vector<mean_count,_std::allocator<mean_count>_>::operator[]
                           (pmVar3,(size_type)*last_return_period_local);
        pvVar4->count = pvVar4->count + 1;
      }
      if ((_summary_id_local != 0.0) || (NAN(_summary_id_local))) {
        local_4c = local_4c - (local_4c - OVar6) / (float)counter;
        FillTVaR(this,tail,max_retperiod_local._0_4_,epcalc,dVar7,local_4c);
      }
      *last_return_period_local = (double)((long)*last_return_period_local + 1);
      counter = counter + 1;
    }
    else {
      *last_return_period_local = (double)((long)*last_return_period_local + 1);
    }
  } while (_summary_id_local <= dVar7);
  if (0.0 < _summary_id_local) {
    *(double *)last_loss_local = _summary_id_local;
    *(OASIS_FLOAT *)current_return_period_local = max_retperiod_local._4_4_;
  }
  return;
}

Assistant:

void aggreports::WriteReturnPeriodOut(const std::vector<int> &fileIDs,
	size_t &nextreturnperiod_index, double &last_return_period,
	OASIS_FLOAT &last_loss, const double current_return_period,
	const OASIS_FLOAT current_loss, const int summary_id, const int eptype,
	const int epcalc, const double max_retperiod, int counter,
	OASIS_FLOAT tvar, T &tail,
	void (aggreports::*WriteOutput)(const std::vector<int>&, const int,
					const int, const int, const double,
					const OASIS_FLOAT),
	std::map<int, std::vector<mean_count>> *mean_map)
#endif
{

  double nextreturnperiod_value = 0;

  do {

    if (nextreturnperiod_index >= returnperiods_.size()) return;

    nextreturnperiod_value = returnperiods_[nextreturnperiod_index];

    if (current_return_period > nextreturnperiod_value) break;

    if (max_retperiod < nextreturnperiod_value) {
      nextreturnperiod_index++;
      continue;
    }

    OASIS_FLOAT loss = GetLoss(nextreturnperiod_value, last_return_period,
			       last_loss, current_return_period, current_loss);
    if (WriteOutput != nullptr) {
    	(this->*WriteOutput)(fileIDs, summary_id, epcalc, eptype,
			     nextreturnperiod_value, loss);
    }
    if (mean_map != nullptr) {   // Wheatsheaf Mean with period weights
      (*mean_map)[summary_id][nextreturnperiod_index].retperiod = nextreturnperiod_value;
      (*mean_map)[summary_id][nextreturnperiod_index].mean += loss;
      (*mean_map)[summary_id][nextreturnperiod_index].count++;
    }
#ifdef ORD_OUTPUT
    if (parquetFileNames_[EPT] != "") {
      WriteParquetOutput(os, summary_id, epcalc, eptype,
			 nextreturnperiod_value, loss);
    }
#endif

    // Tail Value at Risk makes no sense for return period = 0
    if (current_return_period != 0) {
      tvar = tvar - ((tvar - loss) / counter);
      FillTVaR(tail, summary_id, epcalc, nextreturnperiod_value, tvar);
    }

    nextreturnperiod_index++;
    counter++;

  } while (current_return_period <= nextreturnperiod_value);

  if (current_return_period > 0) {
    last_return_period = current_return_period;
    last_loss = current_loss;
  }

}